

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondPersistence.cpp
# Opt level: O2

void __thiscall OpenMD::HBondPersistence::postCorrelate(HBondPersistence *this)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  uint i;
  ulong uVar5;
  
  uVar1 = (this->super_TimeCorrFunc<double>).nTimeBins_;
  piVar3 = (this->super_TimeCorrFunc<double>).count_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->super_TimeCorrFunc<double>).histogram_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = piVar3[uVar5];
    if (iVar2 < 1) {
      pdVar4[uVar5] = 0.0;
    }
    else {
      pdVar4[uVar5] = pdVar4[uVar5] / (double)iVar2;
    }
  }
  return;
}

Assistant:

void HBondPersistence::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = 0;
      }
    }
  }